

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::CalculateHash
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this)

{
  ulong uVar1;
  size_t sVar2;
  PipelineResourceAttribsType *this_00;
  ulong uVar3;
  Uint32 ResIndex;
  
  sVar2 = CalculatePipelineResourceSignatureDescHash
                    (&(this->
                      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      ).m_Desc);
  this->m_Hash = sVar2;
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources != 0) {
    ResIndex = 0;
    do {
      this_00 = GetResourceAttribs(this,ResIndex);
      sVar2 = PipelineResourceAttribsVk::GetHash(this_00);
      uVar3 = sVar2 * 0x200000 + ~sVar2;
      uVar3 = (uVar3 >> 0x18 ^ uVar3) * 0x109;
      uVar1 = (uVar3 >> 0xe ^ uVar3) * 0x15;
      uVar3 = this->m_Hash;
      this->m_Hash = (uVar1 >> 0x1c ^ uVar1) * 0x80000001 + uVar3 * 0x40 + (uVar3 >> 2) + 0x9e3779b9
                     ^ uVar3;
      ResIndex = ResIndex + 1;
    } while (ResIndex <
             (this->
             super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
             ).m_Desc.NumResources);
  }
  return;
}

Assistant:

void CalculateHash()
    {
        const PipelineResourceSignatureImplType* const pThisImpl = static_cast<const PipelineResourceSignatureImplType*>(this);

        m_Hash = CalculatePipelineResourceSignatureDescHash(this->m_Desc);
        for (Uint32 i = 0; i < this->m_Desc.NumResources; ++i)
        {
            const PipelineResourceAttribsType& Attr = pThisImpl->GetResourceAttribs(i);
            HashCombine(m_Hash, Attr.GetHash());
        }
    }